

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

CharCount __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::RepeatCount
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  code *pcVar1;
  EncodedChar EVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  int local_20;
  EncodedChar ec_1;
  uint uStack_1c;
  EncodedChar ec;
  int digits;
  CharCount n;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  uStack_1c = 0;
  local_20 = 0;
  while( true ) {
    EVar2 = ECLookahead(this,0);
    bVar3 = StandardChars<unsigned_char>::IsDigit(this->standardEncodedChars,EVar2);
    if (!bVar3) {
      if (local_20 == 0) {
        Fail(this,-0x7ff5ec67);
      }
      return uStack_1c;
    }
    if (0xccccccc < uStack_1c) break;
    uVar4 = StandardChars<unsigned_char>::DigitValue(this->standardEncodedChars,EVar2);
    if (0x7ffffffe - uVar4 < uStack_1c * 10) break;
    uVar4 = StandardChars<unsigned_char>::DigitValue(this->standardEncodedChars,EVar2);
    uStack_1c = uVar4 + uStack_1c * 10;
    local_20 = local_20 + 1;
    ECConsume(this,1);
  }
  if (local_20 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x47c,"(digits != 0)","digits != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  while( true ) {
    EVar2 = ECLookahead(this,0);
    bVar3 = StandardChars<unsigned_char>::IsDigit(this->standardEncodedChars,EVar2);
    if (!bVar3) break;
    ECConsume(this,1);
  }
  return 0x7ffffffe;
}

Assistant:

CharCount Parser<P, IsLiteral>::RepeatCount()
    {
        CharCount n = 0;
        int digits = 0;
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                if (digits == 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }

                return n;
            }

            if (n > MaxCharCount / 10)
            {
                break;
            }

            n *= 10;
            if (n > MaxCharCount - standardEncodedChars->DigitValue(ec))
            {
                break;
            }

            n += standardEncodedChars->DigitValue(ec);
            digits++;
            ECConsume();
        }

        Assert(digits != 0); // shouldn't be able to reach here with (digits == 0)

        // The token had a value larger than MaxCharCount so we didn't return the value and reached here instead.
        // Consume the rest of the token and return MaxCharCount.
        while (true)
        {
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                return MaxCharCount;
            }
            ECConsume();
        }
    }